

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcStair::~IfcStair(IfcStair *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x949cc0;
  *(undefined8 *)&this->field_0x30 = 0x949dd8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x949ce8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x949d10;
  *(undefined8 *)&this[-1].field_0x118 = 0x949d38;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x949d60;
  *(undefined8 *)&this[-1].field_0x180 = 0x949d88;
  *(undefined8 *)this = 0x949db0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__00949df8);
  operator_delete(&this[-1].field_0x48,400);
  return;
}

Assistant:

IfcStair() : Object("IfcStair") {}